

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::fetchTexture
               (SurfaceAccess *dst,ConstPixelBufferAccess *src,float *texCoord,Vec4 *colorScale,
               Vec4 *colorBias)

{
  float fVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  int i;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  Vector<float,_4> res_1;
  Vec3 triS [2];
  Vector<float,_4> res;
  float local_88;
  uint uStack_84;
  undefined8 uStack_80;
  float local_78 [8];
  float local_58 [6];
  float local_40 [4];
  
  local_78[0] = *texCoord;
  local_78[1] = texCoord[1];
  local_78[2] = texCoord[2];
  local_78[3] = texCoord[3];
  local_78[4] = texCoord[2];
  local_78[5] = texCoord[1];
  if (0 < dst->m_height) {
    iVar10 = 0;
    do {
      iVar5 = dst->m_width;
      if (0 < iVar5) {
        iVar13 = 0;
        do {
          fVar14 = ((float)iVar10 + 0.5) / (float)dst->m_height;
          fVar15 = ((float)iVar13 + 0.5) / (float)iVar5;
          bVar3 = 1.0 <= fVar15 + fVar14;
          if (bVar3) {
            fVar15 = 1.0 - fVar15;
            fVar14 = 1.0 - fVar14;
          }
          uVar4 = (ulong)bVar3;
          fVar1 = local_78[uVar4 * 3];
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_40,(int)src,
                     (int)((local_78[uVar4 * 3 + 1] - fVar1) * fVar14 +
                          (local_78[uVar4 * 3 + 2] - fVar1) * fVar15 + fVar1),0);
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          local_58[3] = 0.0;
          lVar6 = 0;
          do {
            local_58[lVar6] = local_40[lVar6] * colorScale->m_data[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          _local_88 = 0;
          uStack_80 = 0;
          lVar6 = 0;
          do {
            (&local_88)[lVar6] = local_58[lVar6] + colorBias->m_data[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          bVar2 = dst->m_colorMask;
          uVar11 = 0;
          uVar12 = 0;
          if ((bVar2 & 1) != 0) {
            uVar7 = 0x7e - ((int)local_88 >> 0x17);
            uVar12 = (((uint)local_88 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) +
                     0x800000;
            if (8 < uVar7) {
              uVar12 = uVar7;
            }
            uVar12 = uVar12 >> 0x18;
          }
          if ((bVar2 & 2) != 0) {
            uVar7 = 0x7e - ((int)uStack_84 >> 0x17);
            uVar11 = ((uStack_84 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) + 0x800000
            ;
            if (8 < uVar7) {
              uVar11 = uVar7;
            }
            uVar11 = uVar11 >> 0x10 & 0xff00;
          }
          uVar7 = 0;
          if ((bVar2 & 4) != 0) {
            uVar8 = 0x7e - ((int)(uint)uStack_80 >> 0x17);
            uVar7 = (((uint)uStack_80 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar8 & 0x1f)) +
                    0x800000;
            if (8 < uVar8) {
              uVar7 = uVar8;
            }
            uVar7 = uVar7 >> 8 & 0xff0000;
          }
          uVar8 = 0xff000000;
          if ((bVar2 & 8) != 0) {
            uVar9 = 0x7e - ((int)uStack_80._4_4_ >> 0x17);
            uVar8 = ((uStack_80._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar9 & 0x1f)) +
                    0x800000;
            if (8 < uVar9) {
              uVar8 = uVar9;
            }
            uVar8 = uVar8 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)((dst->m_y + iVar10) * dst->m_surface->m_width + dst->m_x + iVar13) * 4) =
               uVar11 | uVar12 | uVar7 | uVar8;
          iVar13 = iVar13 + 1;
          iVar5 = dst->m_width;
        } while (iVar13 < iVar5);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < dst->m_height);
  }
  return;
}

Assistant:

void fetchTexture (const tcu::SurfaceAccess& dst, const tcu::ConstPixelBufferAccess& src, const float* texCoord, const tcu::Vec4& colorScale, const tcu::Vec4& colorBias)
{
	const tcu::Vec4		sq			= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);
	const tcu::Vec3		triS[2]		= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			const float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			const float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			const int	triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			const float	triX	= triNdx ? 1.0f-xf : xf;
			const float	triY	= triNdx ? 1.0f-yf : yf;

			const float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);

			dst.setPixel(src.getPixel((int)s, 0) * colorScale + colorBias, x, y);
		}
	}
}